

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int selectExpander(Walker *pWalker,Select *p)

{
  undefined1 *puVar1;
  char **ppcVar2;
  byte bVar3;
  char cVar4;
  ushort uVar5;
  Parse *pParse;
  sqlite3 *db;
  SrcList *pSrc;
  Column *pCVar6;
  bool bVar7;
  Expr **ppEVar8;
  int iVar9;
  int iVar10;
  Table *pTVar11;
  Select *pSVar12;
  char *pcVar13;
  Expr *pEVar14;
  Expr *pEVar15;
  uint uVar16;
  SrcList_item *pSVar17;
  SrcList *pSVar18;
  long lVar19;
  ulong uVar20;
  ExprList_item *pEVar21;
  ExprList *pList;
  long lVar22;
  Table *pTVar23;
  long lVar24;
  Select *pSVar25;
  long lVar26;
  int iVar27;
  bool bVar28;
  char *local_e0;
  ExprList *local_d8;
  SrcList_item *local_c8;
  int iLeftCol;
  SrcList *local_a8;
  char *local_a0;
  Table *local_98;
  Expr **local_90;
  int local_84;
  ExprList *local_80;
  Select *local_78;
  char *local_70;
  undefined8 local_68;
  Expr *local_60;
  int iLeft;
  uint local_50;
  ExprList_item *local_48;
  long local_40;
  SrcList_item *local_38;
  
  pParse = pWalker->pParse;
  db = pParse->db;
  uVar5 = p->selFlags;
  p->selFlags = uVar5 | 0x10;
  if (db->mallocFailed != '\0') {
    return 2;
  }
  pSVar18 = p->pSrc;
  if ((uVar5 & 0x10) != 0 || pSVar18 == (SrcList *)0x0) {
    return 1;
  }
  local_80 = p->pEList;
  local_78 = p;
  sqlite3SrcListAssignCursors(pParse,pSVar18);
  pSVar17 = pSVar18->a;
  local_a8 = pSVar18;
  local_38 = pSVar17;
  for (iVar27 = 0; iVar27 < pSVar18->nSrc; iVar27 = iVar27 + 1) {
    if (pSVar17->pTab != (Table *)0x0) {
      return 1;
    }
    if (pSVar17->zName == (char *)0x0) {
      pSVar12 = pSVar17->pSelect;
      sqlite3WalkSelect(pWalker,pSVar12);
      pTVar11 = (Table *)sqlite3DbMallocZero(db,0x78);
      pSVar17->pTab = pTVar11;
      if (pTVar11 == (Table *)0x0) {
        return 2;
      }
      pTVar11->nRef = 1;
      pcVar13 = sqlite3MPrintf(db,"sqlite_subquery_%p_",pTVar11);
      pTVar11->zName = pcVar13;
      do {
        pSVar25 = pSVar12;
        pSVar12 = pSVar25->pPrior;
      } while (pSVar12 != (Select *)0x0);
      selectColumnsFromExprList(pParse,pSVar25->pEList,&pTVar11->nCol,&pTVar11->aCol);
      pTVar11->iPKey = -1;
      pTVar11->nRowEst = 1000000;
      pTVar11->tabFlags = pTVar11->tabFlags | 2;
      pSVar18 = local_a8;
    }
    else {
      pTVar11 = sqlite3LocateTableItem(pParse,0,pSVar17);
      pSVar17->pTab = pTVar11;
      if (pTVar11 == (Table *)0x0) {
        return 2;
      }
      if (pTVar11->nRef == 0xffff) {
        sqlite3ErrorMsg(pParse,"too many references to \"%s\": max 65535",pTVar11->zName);
        pSVar17->pTab = (Table *)0x0;
        return 2;
      }
      pTVar11->nRef = pTVar11->nRef + 1;
      if ((pTVar11->pSelect != (Select *)0x0) || ((pTVar11->tabFlags & 0x10) != 0)) {
        iVar9 = sqlite3ViewGetColumnNames(pParse,pTVar11);
        if (iVar9 != 0) {
          return 2;
        }
        pSVar12 = sqlite3SelectDup(db,pTVar11->pSelect,0);
        pSVar17->pSelect = pSVar12;
        sqlite3WalkSelect(pWalker,pSVar12);
      }
    }
    iVar9 = sqlite3IndexedByLookup(pParse,pSVar17);
    if (iVar9 != 0) {
      return 2;
    }
    pSVar17 = pSVar17 + 1;
  }
  if (db->mallocFailed != '\0') {
    return 2;
  }
  pSrc = local_78->pSrc;
  pSVar17 = pSrc->a;
  pSVar18 = pSrc + 1;
  local_90 = &local_78->pWhere;
  for (iVar27 = 0; iVar27 < pSrc->nSrc + -1; iVar27 = iVar27 + 1) {
    pTVar11 = (Table *)pSVar18->a[0].zAlias;
    local_98 = pTVar11;
    local_68 = pSVar17;
    if (pTVar11 != (Table *)0x0 && pSVar17->pTab != (Table *)0x0) {
      bVar3 = (byte)pSVar18->a[0].addrFillSub;
      uVar16 = (bVar3 & 0x20) >> 5;
      iVar9 = 2;
      if ((bVar3 & 4) != 0) {
        lVar19._0_1_ = pSVar18->a[0].jointype;
        lVar19._1_1_ = pSVar18->a[0].field_0x39;
        lVar19._2_1_ = pSVar18->a[0].iSelectId;
        lVar19._3_1_ = pSVar18->a[0].field_0x3b;
        lVar19._4_4_ = pSVar18->a[0].iCursor;
        if ((lVar19 != 0) || (pSVar18->a[0].pOn != (Expr *)0x0)) {
          sqlite3ErrorMsg(pParse,"a NATURAL join may not have an ON or USING clause",0);
          return 2;
        }
        lVar19 = 0;
        for (lVar24 = 0; lVar24 < pTVar11->nCol; lVar24 = lVar24 + 1) {
          iVar10 = tableAndColumnIndex(pSrc,iVar27 + 1,
                                       *(char **)((long)&pTVar11->aCol->zName + lVar19),&iLeft,
                                       &iLeftCol);
          if (iVar10 != 0) {
            addWhereTerm(pParse,pSrc,iLeft,iLeftCol,iVar27 + 1,(int)lVar24,uVar16,local_90);
          }
          lVar19 = lVar19 + 0x30;
        }
      }
      pEVar14 = *(Expr **)&pSVar18->a[0].jointype;
      if (pEVar14 != (Expr *)0x0) {
        if (pSVar18->a[0].pOn != (Expr *)0x0) {
          pcVar13 = "cannot have both ON and USING clauses in the same join";
          goto LAB_001526bd;
        }
        if ((bVar3 & 0x20) != 0) {
          setJoinExpr(pEVar14,pSVar18->a[0].regReturn);
          pEVar14 = *(Expr **)&pSVar18->a[0].jointype;
        }
        ppEVar8 = local_90;
        pEVar14 = sqlite3ExprAnd(pParse->db,*local_90,pEVar14);
        *ppEVar8 = pEVar14;
        pSVar18->a[0].jointype = '\0';
        pSVar18->a[0].field_0x39 = 0;
        pSVar18->a[0].iSelectId = '\0';
        pSVar18->a[0].field_0x3b = 0;
        pSVar18->a[0].iCursor = 0;
      }
      pEVar14 = pSVar18->a[0].pOn;
      if (pEVar14 != (Expr *)0x0) {
        lVar19 = 0;
        local_60 = pEVar14;
        for (lVar24 = 0; lVar24 < (local_60->u).iValue; lVar24 = lVar24 + 1) {
          pcVar13 = *(char **)(*(long *)local_60 + lVar19);
          iVar9 = columnIndex(local_98,pcVar13);
          if ((iVar9 < 0) ||
             (iVar10 = tableAndColumnIndex(pSrc,iVar27 + 1,pcVar13,&iLeft,&iLeftCol), iVar10 == 0))
          {
            sqlite3ErrorMsg(pParse,"cannot join using column %s - column not present in both tables"
                            ,pcVar13);
            return 2;
          }
          addWhereTerm(pParse,pSrc,iLeft,iLeftCol,iVar27 + 1,iVar9,uVar16,local_90);
          lVar19 = lVar19 + 0x10;
        }
      }
    }
    pSVar18 = (SrcList *)&pSVar18->a[0].pIndex;
    pSVar17 = local_68 + 1;
  }
  uVar16 = local_80->nExpr;
  lVar19 = 0;
  uVar20 = 0;
  if (0 < (int)uVar16) {
    uVar20 = (ulong)uVar16;
  }
  for (; uVar20 * 0x20 != lVar19; lVar19 = lVar19 + 0x20) {
    local_48 = local_80->a;
    pcVar13 = *(char **)((long)&local_48->pExpr + lVar19);
    cVar4 = *pcVar13;
    if (cVar4 == 'v') {
      cVar4 = **(char **)(pcVar13 + 0x18);
    }
    if (cVar4 == 'q') {
      local_68 = (SrcList_item *)(CONCAT44(local_68._4_4_,pParse->db->flags) & 0xffffffff0000000c);
      lVar19 = 0;
      local_d8 = (ExprList *)0x0;
      pList = local_80;
      goto LAB_0015220e;
    }
  }
  local_d8 = local_78->pEList;
LAB_00152671:
  if (local_d8 == (ExprList *)0x0) {
    iVar9 = 0;
  }
  else {
    iVar9 = 0;
    if (db->aLimit[2] < local_d8->nExpr) {
      pcVar13 = "too many columns in result set";
      iVar9 = 0;
LAB_001526bd:
      sqlite3ErrorMsg(pParse,pcVar13);
    }
  }
  return iVar9;
LAB_0015220e:
  if ((int)uVar16 <= lVar19) goto LAB_00152659;
  pEVar14 = local_48[lVar19].pExpr;
  if (pEVar14->op == 'q') {
    pEVar14 = (Expr *)0x0;
LAB_00152292:
    bVar7 = false;
    local_c8 = local_38;
    iVar27 = 0;
    pSVar18 = local_a8;
    local_60 = pEVar14;
    local_40 = lVar19;
    while (pList = local_80, iVar27 < pSVar18->nSrc) {
      local_a0 = local_c8->zAlias;
      pTVar11 = local_c8->pTab;
      if (local_a0 == (char *)0x0) {
        local_a0 = pTVar11->zName;
      }
      if (db->mallocFailed != '\0') break;
      pTVar23 = (Table *)local_c8->pSelect;
      if ((pTVar23 == (Table *)0x0) || (((ulong)pTVar23->aCol & 0x2000000) == 0)) {
        if ((pEVar14 == (Expr *)0x0) ||
           (iVar10 = sqlite3_stricmp((char *)pEVar14,local_a0), iVar9 = iVar27, iVar10 == 0)) {
          uVar16 = sqlite3SchemaToIndex(db,pTVar11->pSchema);
          if ((int)uVar16 < 0) {
            local_70 = "*";
          }
          else {
            local_70 = db->aDb[uVar16].zName;
          }
          pTVar23 = (Table *)0x0;
          goto LAB_00152375;
        }
      }
      else {
        local_70 = (char *)0x0;
LAB_00152375:
        bVar28 = pEVar14 != (Expr *)0x0;
        local_90 = (Expr **)CONCAT71(local_90._1_7_,pTVar23 != (Table *)0x0 && bVar28);
        lVar24 = 0x10;
        lVar26 = 0;
        local_98 = pTVar23;
        local_84 = iVar27;
        for (lVar22 = 0; pSVar18 = local_a8, pEVar14 = local_60, lVar19 = local_40, iVar9 = local_84
            , lVar22 < pTVar11->nCol; lVar22 = lVar22 + 1) {
          pCVar6 = pTVar11->aCol;
          pcVar13 = *(char **)((long)&pCVar6->zName + lVar26);
          if ((((char)local_90 == '\0') ||
              (iVar9 = sqlite3MatchSpanName
                                 (*(char **)((long)&((ExprList *)local_98->zName)->a->pExpr + lVar24
                                            ),(char *)0x0,(char *)local_60,(char *)0x0), iVar9 != 0)
              ) && ((*(byte *)((long)&pCVar6->colFlags + lVar26) & 2) == 0)) {
            if ((iVar27 == 0 || bVar28) ||
               ((((local_c8->jointype & 4) == 0 ||
                 (iVar9 = tableAndColumnIndex(local_a8,local_84,pcVar13,(int *)0x0,(int *)0x0),
                 iVar9 == 0)) && (iVar9 = sqlite3IdListIndex(local_c8->pUsing,pcVar13), iVar9 < 0)))
               ) {
              pEVar14 = sqlite3Expr(db,0x1a,pcVar13);
              if (((int)local_68 == 4) || (1 < local_a8->nSrc)) {
                pEVar15 = sqlite3Expr(db,0x1a,local_a0);
                pEVar14 = sqlite3PExpr(pParse,0x76,pEVar15,pEVar14,(Token *)0x0);
                if (local_70 != (char *)0x0) {
                  pEVar15 = sqlite3Expr(db,0x1a,local_70);
                  pEVar14 = sqlite3PExpr(pParse,0x76,pEVar15,pEVar14,(Token *)0x0);
                }
                if ((int)local_68 != 4) goto LAB_001524fe;
                pcVar13 = sqlite3MPrintf(db,"%s.%s",local_a0);
                local_e0 = pcVar13;
              }
              else {
LAB_001524fe:
                local_e0 = (char *)0x0;
              }
              local_d8 = sqlite3ExprListAppend(pParse,local_d8,pEVar14);
              _iLeft = pcVar13;
              local_50 = sqlite3Strlen30(pcVar13);
              sqlite3ExprListSetName(pParse,local_d8,(Token *)&iLeft,0);
              if ((local_d8 != (ExprList *)0x0) && ((local_78->selFlags & 0x200) != 0)) {
                iVar9 = local_d8->nExpr;
                pEVar21 = local_d8->a;
                if (local_98 == (Table *)0x0) {
                  pcVar13 = sqlite3MPrintf(db,"%s.%s.%s",local_70);
                }
                else {
                  pcVar13 = sqlite3DbStrDup(db,*(char **)((long)&((ExprList *)local_98->zName)->a->
                                                                 pExpr + lVar24));
                }
                pEVar21[(long)iVar9 + -1].zSpan = pcVar13;
                puVar1 = &pEVar21[(long)iVar9 + -1].field_0x19;
                *puVar1 = *puVar1 | 2;
              }
              sqlite3DbFree(db,local_e0);
            }
            bVar7 = true;
          }
          lVar26 = lVar26 + 0x30;
          lVar24 = lVar24 + 0x20;
        }
      }
      local_c8 = local_c8 + 1;
      iVar27 = iVar9 + 1;
    }
    if (!bVar7) {
      if (pEVar14 == (Expr *)0x0) {
        sqlite3ErrorMsg(pParse,"no tables specified");
      }
      else {
        sqlite3ErrorMsg(pParse,"no such table: %s",pEVar14);
      }
    }
  }
  else {
    if ((pEVar14->op == 'v') && (pEVar14->pRight->op == 'q')) {
      pEVar14 = (Expr *)(pEVar14->pLeft->u).zToken;
      goto LAB_00152292;
    }
    pEVar21 = local_48 + lVar19;
    local_d8 = sqlite3ExprListAppend(pParse,local_d8,pEVar14);
    if (local_d8 != (ExprList *)0x0) {
      pcVar13 = pEVar21->zSpan;
      ppcVar2 = &local_d8->a[(long)local_d8->nExpr + -1].zName;
      *ppcVar2 = pEVar21->zName;
      ppcVar2[1] = pcVar13;
      pEVar21->zName = (char *)0x0;
      pEVar21->zSpan = (char *)0x0;
    }
    pEVar21->pExpr = (Expr *)0x0;
    pList = local_80;
  }
  lVar19 = lVar19 + 1;
  uVar16 = pList->nExpr;
  goto LAB_0015220e;
LAB_00152659:
  sqlite3ExprListDelete(db,pList);
  local_78->pEList = local_d8;
  goto LAB_00152671;
}

Assistant:

static int selectExpander(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  int i, j, k;
  SrcList *pTabList;
  ExprList *pEList;
  struct SrcList_item *pFrom;
  sqlite3 *db = pParse->db;
  Expr *pE, *pRight, *pExpr;
  u16 selFlags = p->selFlags;

  p->selFlags |= SF_Expanded;
  if( db->mallocFailed  ){
    return WRC_Abort;
  }
  if( NEVER(p->pSrc==0) || (selFlags & SF_Expanded)!=0 ){
    return WRC_Prune;
  }
  pTabList = p->pSrc;
  pEList = p->pEList;

  /* Make sure cursor numbers have been assigned to all entries in
  ** the FROM clause of the SELECT statement.
  */
  sqlite3SrcListAssignCursors(pParse, pTabList);

  /* Look up every table named in the FROM clause of the select.  If
  ** an entry of the FROM clause is a subquery instead of a table or view,
  ** then create a transient table structure to describe the subquery.
  */
  for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
    Table *pTab;
    if( pFrom->pTab!=0 ){
      /* This statement has already been prepared.  There is no need
      ** to go further. */
      assert( i==0 );
      return WRC_Prune;
    }
    if( pFrom->zName==0 ){
#ifndef SQLITE_OMIT_SUBQUERY
      Select *pSel = pFrom->pSelect;
      /* A sub-query in the FROM clause of a SELECT */
      assert( pSel!=0 );
      assert( pFrom->pTab==0 );
      sqlite3WalkSelect(pWalker, pSel);
      pFrom->pTab = pTab = sqlite3DbMallocZero(db, sizeof(Table));
      if( pTab==0 ) return WRC_Abort;
      pTab->nRef = 1;
      pTab->zName = sqlite3MPrintf(db, "sqlite_subquery_%p_", (void*)pTab);
      while( pSel->pPrior ){ pSel = pSel->pPrior; }
      selectColumnsFromExprList(pParse, pSel->pEList, &pTab->nCol, &pTab->aCol);
      pTab->iPKey = -1;
      pTab->nRowEst = 1000000;
      pTab->tabFlags |= TF_Ephemeral;
#endif
    }else{
      /* An ordinary table or view name in the FROM clause */
      assert( pFrom->pTab==0 );
      pFrom->pTab = pTab = sqlite3LocateTableItem(pParse, 0, pFrom);
      if( pTab==0 ) return WRC_Abort;
      if( pTab->nRef==0xffff ){
        sqlite3ErrorMsg(pParse, "too many references to \"%s\": max 65535",
           pTab->zName);
        pFrom->pTab = 0;
        return WRC_Abort;
      }
      pTab->nRef++;
#if !defined(SQLITE_OMIT_VIEW) || !defined (SQLITE_OMIT_VIRTUALTABLE)
      if( pTab->pSelect || IsVirtual(pTab) ){
        /* We reach here if the named table is a really a view */
        if( sqlite3ViewGetColumnNames(pParse, pTab) ) return WRC_Abort;
        assert( pFrom->pSelect==0 );
        pFrom->pSelect = sqlite3SelectDup(db, pTab->pSelect, 0);
        sqlite3WalkSelect(pWalker, pFrom->pSelect);
      }
#endif
    }

    /* Locate the index named by the INDEXED BY clause, if any. */
    if( sqlite3IndexedByLookup(pParse, pFrom) ){
      return WRC_Abort;
    }
  }

  /* Process NATURAL keywords, and ON and USING clauses of joins.
  */
  if( db->mallocFailed || sqliteProcessJoin(pParse, p) ){
    return WRC_Abort;
  }

  /* For every "*" that occurs in the column list, insert the names of
  ** all columns in all tables.  And for every TABLE.* insert the names
  ** of all columns in TABLE.  The parser inserted a special expression
  ** with the TK_ALL operator for each "*" that it found in the column list.
  ** The following code just has to locate the TK_ALL expressions and expand
  ** each one to the list of all columns in all tables.
  **
  ** The first loop just checks to see if there are any "*" operators
  ** that need expanding.
  */
  for(k=0; k<pEList->nExpr; k++){
    pE = pEList->a[k].pExpr;
    if( pE->op==TK_ALL ) break;
    assert( pE->op!=TK_DOT || pE->pRight!=0 );
    assert( pE->op!=TK_DOT || (pE->pLeft!=0 && pE->pLeft->op==TK_ID) );
    if( pE->op==TK_DOT && pE->pRight->op==TK_ALL ) break;
  }
  if( k<pEList->nExpr ){
    /*
    ** If we get here it means the result set contains one or more "*"
    ** operators that need to be expanded.  Loop through each expression
    ** in the result set and expand them one by one.
    */
    struct ExprList_item *a = pEList->a;
    ExprList *pNew = 0;
    int flags = pParse->db->flags;
    int longNames = (flags & SQLITE_FullColNames)!=0
                      && (flags & SQLITE_ShortColNames)==0;

    /* When processing FROM-clause subqueries, it is always the case
    ** that full_column_names=OFF and short_column_names=ON.  The
    ** sqlite3ResultSetOfSelect() routine makes it so. */
    assert( (p->selFlags & SF_NestedFrom)==0
          || ((flags & SQLITE_FullColNames)==0 &&
              (flags & SQLITE_ShortColNames)!=0) );

    for(k=0; k<pEList->nExpr; k++){
      pE = a[k].pExpr;
      pRight = pE->pRight;
      assert( pE->op!=TK_DOT || pRight!=0 );
      if( pE->op!=TK_ALL && (pE->op!=TK_DOT || pRight->op!=TK_ALL) ){
        /* This particular expression does not need to be expanded.
        */
        pNew = sqlite3ExprListAppend(pParse, pNew, a[k].pExpr);
        if( pNew ){
          pNew->a[pNew->nExpr-1].zName = a[k].zName;
          pNew->a[pNew->nExpr-1].zSpan = a[k].zSpan;
          a[k].zName = 0;
          a[k].zSpan = 0;
        }
        a[k].pExpr = 0;
      }else{
        /* This expression is a "*" or a "TABLE.*" and needs to be
        ** expanded. */
        int tableSeen = 0;      /* Set to 1 when TABLE matches */
        char *zTName = 0;       /* text of name of TABLE */
        if( pE->op==TK_DOT ){
          assert( pE->pLeft!=0 );
          assert( !ExprHasProperty(pE->pLeft, EP_IntValue) );
          zTName = pE->pLeft->u.zToken;
        }
        for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
          Table *pTab = pFrom->pTab;
          Select *pSub = pFrom->pSelect;
          char *zTabName = pFrom->zAlias;
          const char *zSchemaName = 0;
          int iDb;
          if( zTabName==0 ){
            zTabName = pTab->zName;
          }
          if( db->mallocFailed ) break;
          if( pSub==0 || (pSub->selFlags & SF_NestedFrom)==0 ){
            pSub = 0;
            if( zTName && sqlite3StrICmp(zTName, zTabName)!=0 ){
              continue;
            }
            iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
            zSchemaName = iDb>=0 ? db->aDb[iDb].zName : "*";
          }
          for(j=0; j<pTab->nCol; j++){
            char *zName = pTab->aCol[j].zName;
            char *zColname;  /* The computed column name */
            char *zToFree;   /* Malloced string that needs to be freed */
            Token sColname;  /* Computed column name as a token */

            assert( zName );
            if( zTName && pSub
             && sqlite3MatchSpanName(pSub->pEList->a[j].zSpan, 0, zTName, 0)==0
            ){
              continue;
            }

            /* If a column is marked as 'hidden' (currently only possible
            ** for virtual tables), do not include it in the expanded
            ** result-set list.
            */
            if( IsHiddenColumn(&pTab->aCol[j]) ){
              assert(IsVirtual(pTab));
              continue;
            }
            tableSeen = 1;

            if( i>0 && zTName==0 ){
              if( (pFrom->jointype & JT_NATURAL)!=0
                && tableAndColumnIndex(pTabList, i, zName, 0, 0)
              ){
                /* In a NATURAL join, omit the join columns from the 
                ** table to the right of the join */
                continue;
              }
              if( sqlite3IdListIndex(pFrom->pUsing, zName)>=0 ){
                /* In a join with a USING clause, omit columns in the
                ** using clause from the table on the right. */
                continue;
              }
            }
            pRight = sqlite3Expr(db, TK_ID, zName);
            zColname = zName;
            zToFree = 0;
            if( longNames || pTabList->nSrc>1 ){
              Expr *pLeft;
              pLeft = sqlite3Expr(db, TK_ID, zTabName);
              pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pRight, 0);
              if( zSchemaName ){
                pLeft = sqlite3Expr(db, TK_ID, zSchemaName);
                pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pExpr, 0);
              }
              if( longNames ){
                zColname = sqlite3MPrintf(db, "%s.%s", zTabName, zName);
                zToFree = zColname;
              }
            }else{
              pExpr = pRight;
            }
            pNew = sqlite3ExprListAppend(pParse, pNew, pExpr);
            sColname.z = zColname;
            sColname.n = sqlite3Strlen30(zColname);
            sqlite3ExprListSetName(pParse, pNew, &sColname, 0);
            if( pNew && (p->selFlags & SF_NestedFrom)!=0 ){
              struct ExprList_item *pX = &pNew->a[pNew->nExpr-1];
              if( pSub ){
                pX->zSpan = sqlite3DbStrDup(db, pSub->pEList->a[j].zSpan);
                testcase( pX->zSpan==0 );
              }else{
                pX->zSpan = sqlite3MPrintf(db, "%s.%s.%s",
                                           zSchemaName, zTabName, zColname);
                testcase( pX->zSpan==0 );
              }
              pX->bSpanIsTab = 1;
            }
            sqlite3DbFree(db, zToFree);
          }
        }
        if( !tableSeen ){
          if( zTName ){
            sqlite3ErrorMsg(pParse, "no such table: %s", zTName);
          }else{
            sqlite3ErrorMsg(pParse, "no tables specified");
          }
        }
      }
    }
    sqlite3ExprListDelete(db, pEList);
    p->pEList = pNew;
  }
#if SQLITE_MAX_COLUMN
  if( p->pEList && p->pEList->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many columns in result set");
  }
#endif
  return WRC_Continue;
}